

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_slice.c
# Opt level: O3

_Bool slice_fclose(ALLEGRO_FILE *f)

{
  _Bool _Var1;
  undefined8 *ptr;
  
  ptr = (undefined8 *)al_get_file_userdata(f);
  _Var1 = al_fseek((ALLEGRO_FILE *)*ptr,ptr[3] + ptr[1],0);
  al_free_with_context
            (ptr,0x2c,
             "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/src/file_slice.c"
             ,"slice_fclose");
  return _Var1;
}

Assistant:

static bool slice_fclose(ALLEGRO_FILE *f)
{
   SLICE_DATA *slice = al_get_file_userdata(f);
   bool ret;

   /* seek to end of slice */
   ret = al_fseek(slice->fp, slice->anchor + slice->size, ALLEGRO_SEEK_SET);

   al_free(slice);

   return ret;
}